

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_circle_node(REF_NODE ref_node)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  REF_DBL d [12];
  REF_DBL m [6];
  double local_c8;
  double local_c0;
  undefined8 local_b8;
  double local_b0;
  undefined8 local_a8;
  double local_a0;
  double local_98;
  undefined8 local_90;
  double local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  REF_DBL local_68 [7];
  
  if (0 < ref_node->max) {
    lVar3 = 2;
    lVar2 = 0;
    do {
      if (-1 < ref_node->global[lVar2]) {
        dVar6 = ref_node->real[lVar3 + -2];
        dVar5 = ref_node->real[lVar3];
        dVar4 = dVar6 * dVar6 + dVar5 * dVar5;
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        dVar5 = atan2(dVar5,dVar6);
        dVar6 = 1.0 - dVar4;
        if (dVar6 <= -dVar6) {
          dVar6 = -dVar6;
        }
        dVar4 = dVar4 * 0.1 + dVar6 * 1.5;
        dVar6 = dVar6 * 1.5 + 0.0005;
        local_c8 = 1.0 / (dVar6 * dVar6);
        local_c0 = 1.0 / (dVar4 * dVar4);
        local_b8 = 0x3ff0000000000000;
        local_b0 = cos(dVar5);
        local_a8 = 0;
        local_a0 = sin(dVar5);
        local_98 = sin(dVar5);
        local_98 = -local_98;
        local_90 = 0;
        local_88 = cos(dVar5);
        local_80 = 0;
        local_78 = 0x3ff0000000000000;
        local_70 = 0;
        ref_matrix_form_m(&local_c8,local_68);
        uVar1 = ref_node_metric_set(ref_node,(REF_INT)lVar2,local_68);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x181,"ref_metric_circle_node",(ulong)uVar1,"set node met");
          return uVar1;
        }
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0xf;
    } while (lVar2 < ref_node->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_circle_node(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL x, z, r, t;
  REF_DBL hy, h1, h2;
  REF_DBL d[12], m[6];

  each_ref_node_valid_node(ref_node, node) {
    x = ref_node_xyz(ref_node, 0, node);
    z = ref_node_xyz(ref_node, 2, node);
    r = sqrt(x * x + z * z);
    t = atan2(z, x);
    hy = 1.0;
    h1 = 0.0005 + 1.5 * ABS(1.0 - r);
    h2 = 0.1 * r + 1.5 * ABS(1.0 - r);
    ref_matrix_eig(d, 0) = 1.0 / (h1 * h1);
    ref_matrix_eig(d, 1) = 1.0 / (h2 * h2);
    ref_matrix_eig(d, 2) = 1.0 / (hy * hy);
    ref_matrix_vec(d, 0, 0) = cos(t);
    ref_matrix_vec(d, 1, 0) = 0.0;
    ref_matrix_vec(d, 2, 0) = sin(t);
    ref_matrix_vec(d, 0, 1) = -sin(t);
    ref_matrix_vec(d, 1, 1) = 0.0;
    ref_matrix_vec(d, 2, 1) = cos(t);
    ref_matrix_vec(d, 0, 2) = 0.0;
    ref_matrix_vec(d, 1, 2) = 1.0;
    ref_matrix_vec(d, 2, 2) = 0.0;
    ref_matrix_form_m(d, m);
    RSS(ref_node_metric_set(ref_node, node, m), "set node met");
  }

  return REF_SUCCESS;
}